

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::GetTextureSubImage::Errors::prepare(Errors *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GLubyte *pGVar6;
  Functions *gl;
  Errors *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (((((this->m_texture_1D == 0) && (this->m_texture_1D_array == 0)) && (this->m_texture_2D == 0))
      && ((this->m_texture_rectangle == 0 && (this->m_texture_2D_compressed == 0)))) &&
     (this->m_texture_2D_multisampled == 0)) {
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture_1D);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture_1D_array);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture_2D);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture_rectangle);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture_2D_compressed);
    (**(code **)(lVar4 + 0x6f8))(1,&this->m_texture_2D_multisampled);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGenTextures call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                    ,0xad);
    if (((this->m_texture_1D != 0) && (this->m_texture_1D_array != 0)) && (this->m_texture_2D != 0))
    {
      (**(code **)(lVar4 + 0xb8))(0xde0,this->m_texture_1D);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindTexture call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xb7);
      (**(code **)(lVar4 + 0x1308))(0xde0,0,0x8058,2,0,0x1908,0x1401,"");
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage1D call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xba);
      (**(code **)(lVar4 + 0xb8))(0x8c18,this->m_texture_1D_array);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindTexture call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xbd);
      (**(code **)(lVar4 + 0x1310))(0x8c18,0,0x8058,2,2,0,0x1908,0x1401,"");
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage1D call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xc1);
      (**(code **)(lVar4 + 0xb8))(0xde1,this->m_texture_2D);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindTexture call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xc4);
      (**(code **)(lVar4 + 0x1310))(0xde1,0,0x8058,2,2,0,0x1908,0x1401,"");
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage1D call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,200);
      (**(code **)(lVar4 + 0xb8))(0x84f5,this->m_texture_rectangle);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindTexture call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xcb);
      (**(code **)(lVar4 + 0x1310))(0x84f5,0,0x8058,2,2,0,0x1908,0x1401,"");
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage1D call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xcf);
      (**(code **)(lVar4 + 0xb8))(0xde1,this->m_texture_2D_compressed);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindTexture call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xd3);
      (**(code **)(lVar4 + 0x288))(0xde1,0,0x9274,4,4,0,8,s_texture_data_compressed);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage1D call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xd8);
      (**(code **)(lVar4 + 0xb8))(0x9100,this->m_texture_2D_multisampled);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glBindTexture call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xdc);
      (**(code **)(lVar4 + 0x1318))(0x9100,1,0x8229,2,2);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage1D call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGetTextureSubImageTests.cpp"
                      ,0xdf);
      pRVar3 = deqp::Context::getRenderContext(this->m_context);
      iVar1 = (*pRVar3->_vptr_RenderContext[7])(pRVar3,"glGetTextureSubImage");
      this->m_gl_GetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_00,iVar1);
      pRVar3 = deqp::Context::getRenderContext(this->m_context);
      iVar1 = (*pRVar3->_vptr_RenderContext[7])(pRVar3,"glGetCompressedTextureSubImage");
      this->m_gl_GetCompressedTextureSubImage =
           (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_01,iVar1);
      if ((this->m_gl_GetTextureSubImage != (PFNGLGETTEXTURESUBIMAGEPROC)0x0) &&
         (this->m_gl_GetCompressedTextureSubImage != (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)0x0)) {
        pGVar6 = (GLubyte *)malloc(0x10);
        this->m_destination_buffer = pGVar6;
        if (this->m_destination_buffer == (GLubyte *)0x0) {
          puVar5 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar5 = 0;
          __cxa_throw(puVar5,&int::typeinfo,0);
        }
        return;
      }
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void gl4cts::GetTextureSubImage::Errors::prepare()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* If already initialized throw exception. */
	if (m_texture_1D || m_texture_1D_array || m_texture_2D || m_texture_rectangle || m_texture_2D_compressed ||
		m_texture_2D_multisampled)
	{
		throw 0;
	}

	/* Generate texture ids. */
	gl.genTextures(1, &m_texture_1D);
	gl.genTextures(1, &m_texture_1D_array);
	gl.genTextures(1, &m_texture_2D);
	gl.genTextures(1, &m_texture_rectangle);
	gl.genTextures(1, &m_texture_2D_compressed);
	gl.genTextures(1, &m_texture_2D_multisampled);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures call failed.");

	/* If one is not initialized throw exception. */
	if (!(m_texture_1D && m_texture_1D_array && m_texture_2D))
	{
		throw 0;
	}

	/* Upload texture data. */
	gl.bindTexture(GL_TEXTURE_1D, m_texture_1D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	gl.texImage1D(GL_TEXTURE_1D, 0, GL_RGBA8, s_texture_data_width, 0, GL_RGBA, GL_UNSIGNED_BYTE, s_texture_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");

	gl.bindTexture(GL_TEXTURE_1D_ARRAY, m_texture_1D_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	gl.texImage2D(GL_TEXTURE_1D_ARRAY, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0, GL_RGBA,
				  GL_UNSIGNED_BYTE, s_texture_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_texture_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0, GL_RGBA, GL_UNSIGNED_BYTE,
				  s_texture_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");

	gl.bindTexture(GL_TEXTURE_RECTANGLE, m_texture_rectangle);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	gl.texImage2D(GL_TEXTURE_RECTANGLE, 0, GL_RGBA8, s_texture_data_width, s_texture_data_height, 0, GL_RGBA,
				  GL_UNSIGNED_BYTE, s_texture_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");

	/* Upload compressed texture data. */
	gl.bindTexture(GL_TEXTURE_2D, m_texture_2D_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	gl.compressedTexImage2D(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGB8_ETC2, s_texture_data_compressed_width,
							s_texture_data_compressed_height, 0, s_texture_data_compressed_size,
							s_texture_data_compressed);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");

	/* Prepare multisampled texture storage. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, m_texture_2D_multisampled);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture call failed.");

	gl.texImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 1, GL_R8, s_texture_data_width, s_texture_data_height, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage1D call failed.");

	/* Prepare function pointers. */
	m_gl_GetTextureSubImage =
		(PFNGLGETTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress("glGetTextureSubImage");
	m_gl_GetCompressedTextureSubImage =
		(PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress(
			"glGetCompressedTextureSubImage");

	if ((DE_NULL == m_gl_GetTextureSubImage) || (DE_NULL == m_gl_GetCompressedTextureSubImage))
	{
		throw 0;
	}

	/* Allocate destination buffer. */
	m_destination_buffer = (glw::GLubyte*)malloc(s_destination_buffer_size);

	if (DE_NULL == m_destination_buffer)
	{
		throw 0;
	}
}